

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# compressionTables.cpp
# Opt level: O0

void testB44Table(string *param_1)

{
  bool bVar1;
  uint16_t uVar2;
  float fVar3;
  double dVar4;
  undefined4 extraout_XMM0_Db;
  undefined4 extraout_XMM0_Db_00;
  half h_1;
  int i_1;
  half h;
  int i;
  int iMax;
  undefined4 in_stack_ffffffffffffffc8;
  float in_stack_ffffffffffffffcc;
  uint in_stack_ffffffffffffffd0;
  uint in_stack_ffffffffffffffd4;
  char *in_stack_ffffffffffffffd8;
  char *in_stack_ffffffffffffffe0;
  int local_18;
  half local_12;
  int local_10;
  undefined4 local_c;
  
  local_c = 0x10000;
  for (local_10 = 0; local_10 < 0x10000; local_10 = local_10 + 1) {
    Imath_3_2::half::setBits(&local_12,(uint16_t)local_10);
    bVar1 = Imath_3_2::half::isFinite((half *)0x124b72);
    if (bVar1) {
      fVar3 = Imath_3_2::half::operator_cast_to_float((half *)0x124b8f);
      in_stack_ffffffffffffffd8 = (char *)(double)fVar3;
      dVar4 = log(65504.0);
      if ((double)in_stack_ffffffffffffffd8 < dVar4 * 8.0) {
        fVar3 = Imath_3_2::half::operator_cast_to_float((half *)0x124bdf);
        std::exp((double)CONCAT44(extraout_XMM0_Db,fVar3 / 8.0));
        Imath_3_2::half::operator=
                  ((half *)CONCAT44(in_stack_ffffffffffffffd4,in_stack_ffffffffffffffd0),
                   in_stack_ffffffffffffffcc);
      }
      else {
        Imath_3_2::half::operator=
                  ((half *)CONCAT44(in_stack_ffffffffffffffd4,in_stack_ffffffffffffffd0),
                   in_stack_ffffffffffffffcc);
      }
    }
    else {
      Imath_3_2::half::operator=
                ((half *)CONCAT44(in_stack_ffffffffffffffd4,in_stack_ffffffffffffffd0),
                 in_stack_ffffffffffffffcc);
    }
    in_stack_ffffffffffffffd4 = (uint)exrcore_expTable[local_10];
    uVar2 = Imath_3_2::half::bits(&local_12);
    if (in_stack_ffffffffffffffd4 != uVar2) {
      core_test_fail(in_stack_ffffffffffffffe0,in_stack_ffffffffffffffd8,in_stack_ffffffffffffffd4,
                     (char *)CONCAT44(in_stack_ffffffffffffffcc,in_stack_ffffffffffffffc8));
    }
  }
  for (local_18 = 0; local_18 < 0x10000; local_18 = local_18 + 1) {
    Imath_3_2::half::setBits((half *)&stack0xffffffffffffffe6,(uint16_t)local_18);
    bVar1 = Imath_3_2::half::isFinite((half *)0x124c8c);
    if ((!bVar1) || (fVar3 = Imath_3_2::half::operator_cast_to_float((half *)0x124c9c), fVar3 < 0.0)
       ) {
      Imath_3_2::half::operator=
                ((half *)CONCAT44(in_stack_ffffffffffffffd4,in_stack_ffffffffffffffd0),
                 in_stack_ffffffffffffffcc);
    }
    else {
      fVar3 = Imath_3_2::half::operator_cast_to_float((half *)0x124cc0);
      std::log((double)CONCAT44(extraout_XMM0_Db_00,fVar3));
      Imath_3_2::half::operator=
                ((half *)CONCAT44(in_stack_ffffffffffffffd4,in_stack_ffffffffffffffd0),
                 in_stack_ffffffffffffffcc);
    }
    in_stack_ffffffffffffffd0 = (uint)exrcore_logTable[local_18];
    uVar2 = Imath_3_2::half::bits((half *)&stack0xffffffffffffffe6);
    if (in_stack_ffffffffffffffd0 != uVar2) {
      core_test_fail(in_stack_ffffffffffffffe0,in_stack_ffffffffffffffd8,in_stack_ffffffffffffffd4,
                     (char *)CONCAT44(in_stack_ffffffffffffffcc,in_stack_ffffffffffffffc8));
    }
  }
  return;
}

Assistant:

void
testB44Table (const std::string&)
{
    const int iMax = (1 << 16);

    for (int i = 0; i < iMax; i++)
    {
        half h;
        h.setBits (i);

        if (!h.isFinite ())
            h = 0;
        else if (h >= 8 * log (HALF_MAX))
            h = HALF_MAX;
        else
            h = exp (h / 8);

        EXRCORE_TEST (exrcore_expTable[i] == h.bits ());
    }

    for (int i = 0; i < iMax; i++)
    {
        half h;
        h.setBits (i);

        if (!h.isFinite () || h < 0)
            h = 0;
        else
            h = 8 * log (h);

        EXRCORE_TEST (exrcore_logTable[i] == h.bits ());
    }
}